

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

LY_ERR ly_parse_instance_predicate
                 (char **pred,size_t limit,LYD_FORMAT format,char **prefix,size_t *prefix_len,
                 char **id,size_t *id_len,char **value,size_t *value_len,char **errmsg)

{
  char cVar1;
  LY_ERR LVar2;
  ushort **ppuVar3;
  ulong uVar4;
  bool bVar5;
  char local_59;
  char quot;
  ulong uStack_58;
  uint8_t expr;
  size_t offset;
  char *in;
  char **ppcStack_40;
  LY_ERR ret;
  char **id_local;
  size_t *prefix_len_local;
  char **prefix_local;
  size_t sStack_20;
  LYD_FORMAT format_local;
  size_t limit_local;
  char **pred_local;
  
  in._4_4_ = LY_EVALID;
  offset = (size_t)*pred;
  uStack_58 = 1;
  local_59 = '\0';
  ppcStack_40 = id;
  id_local = (char **)prefix_len;
  prefix_len_local = (size_t *)prefix;
  prefix_local._4_4_ = format;
  sStack_20 = limit;
  limit_local = (size_t)pred;
  if (*(char *)offset != '[') {
    __assert_fail("in[0] == \'[\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/ly_common.c"
                  ,0x362,
                  "LY_ERR ly_parse_instance_predicate(const char **, size_t, LYD_FORMAT, const char **, size_t *, const char **, size_t *, const char **, size_t *, const char **)"
                 );
  }
  *value = (char *)0x0;
  *id = (char *)0x0;
  *prefix = (char *)0x0;
  *value_len = 0;
  *id_len = 0;
  *prefix_len = 0;
  while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)(offset + uStack_58)] & 0x2000) != 0)
  {
    uStack_58 = uStack_58 + 1;
  }
  ppuVar3 = __ctype_b_loc();
  if (((*ppuVar3)[(int)*(char *)(offset + uStack_58)] & 0x800) == 0) {
    if (*(char *)(offset + uStack_58) == '.') {
      *ppcStack_40 = (char *)(offset + uStack_58);
      *id_len = 1;
      uStack_58 = uStack_58 + 1;
      local_59 = '\x01';
    }
    else {
      if (*(char *)(offset + uStack_58) == '-') {
        *errmsg = 
        "Invalid instance predicate format (negative position or invalid node-identifier).";
        goto LAB_00110a61;
      }
      offset = offset + uStack_58;
      LVar2 = ly_parse_nodeid((char **)&offset,(char **)prefix_len_local,(size_t *)id_local,
                              ppcStack_40,id_len);
      if (LVar2 != LY_SUCCESS) {
        *errmsg = "Invalid node-identifier.";
        goto LAB_00110a61;
      }
      if ((prefix_local._4_4_ == LYD_XML) && (*prefix_len_local == 0)) {
        *errmsg = "Missing prefix of a node name.";
        goto LAB_00110a61;
      }
      uStack_58 = offset - *(long *)limit_local;
      offset = *(size_t *)limit_local;
      local_59 = '\x02';
    }
  }
  else {
    if (*(char *)(offset + uStack_58) == '0') {
      *errmsg = "The position predicate cannot be zero.";
      goto LAB_00110a61;
    }
    *value = (char *)(offset + uStack_58);
    do {
      uStack_58 = uStack_58 + 1;
      ppuVar3 = __ctype_b_loc();
    } while (((*ppuVar3)[(int)*(char *)(offset + uStack_58)] & 0x800) != 0);
    *value_len = (offset + uStack_58) - (long)*value;
  }
  if (local_59 != '\0') {
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)(offset + uStack_58)] & 0x2000) != 0
          ) {
      uStack_58 = uStack_58 + 1;
    }
    if (*(char *)(offset + uStack_58) != '=') {
      if (local_59 == '\x01') {
        *errmsg = "Unexpected character instead of \'=\' in leaf-list-predicate.";
      }
      else {
        *errmsg = "Unexpected character instead of \'=\' in key-predicate.";
      }
      goto LAB_00110a61;
    }
    do {
      uVar4 = uStack_58;
      uStack_58 = uVar4 + 1;
      ppuVar3 = __ctype_b_loc();
    } while (((*ppuVar3)[(int)*(char *)(offset + uStack_58)] & 0x2000) != 0);
    uVar4 = uVar4 + 2;
    cVar1 = *(char *)(offset + uStack_58);
    uStack_58 = uVar4;
    if ((cVar1 != '\'') && (cVar1 != '\"')) {
      *errmsg = "String value is not quoted.";
      goto LAB_00110a61;
    }
    *value = (char *)(offset + uVar4);
    while( true ) {
      bVar5 = false;
      if (((uStack_58 < sStack_20) && (bVar5 = true, *(char *)(offset + uStack_58) == cVar1)) &&
         (bVar5 = false, uStack_58 != 0)) {
        bVar5 = *(char *)(offset + (uStack_58 - 1)) == '\\';
      }
      if (!bVar5) break;
      uStack_58 = uStack_58 + 1;
    }
    if (*(char *)(offset + uStack_58) != cVar1) {
      *errmsg = "Value is not terminated quoted-string.";
      goto LAB_00110a61;
    }
    *value_len = (offset + uStack_58) - (long)*value;
    uStack_58 = uStack_58 + 1;
  }
  while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)(offset + uStack_58)] & 0x2000) != 0)
  {
    uStack_58 = uStack_58 + 1;
  }
  if (*(char *)(offset + uStack_58) == ']') {
    if (uStack_58 + 1 <= sStack_20) {
      *(size_t *)limit_local = offset + uStack_58 + 1;
      return LY_SUCCESS;
    }
    *errmsg = "Predicate is incomplete.";
    *value = (char *)0x0;
    *ppcStack_40 = (char *)0x0;
    *prefix_len_local = 0;
    *value_len = 0;
    *id_len = 0;
    *id_local = (char *)0x0;
    uStack_58 = sStack_20;
    in._4_4_ = LY_EINVAL;
  }
  else if (local_59 == '\0') {
    *errmsg = "Predicate (pos) is not terminated by \']\' character.";
  }
  else if (local_59 == '\x01') {
    *errmsg = "Predicate (leaf-list-predicate) is not terminated by \']\' character.";
  }
  else {
    *errmsg = "Predicate (key-predicate) is not terminated by \']\' character.";
  }
LAB_00110a61:
  *(size_t *)limit_local = offset + uStack_58;
  return in._4_4_;
}

Assistant:

LY_ERR
ly_parse_instance_predicate(const char **pred, size_t limit, LYD_FORMAT format,
        const char **prefix, size_t *prefix_len, const char **id, size_t *id_len, const char **value, size_t *value_len,
        const char **errmsg)
{
    LY_ERR ret = LY_EVALID;
    const char *in = *pred;
    size_t offset = 1;
    uint8_t expr = 0; /* 0 - position predicate; 1 - leaf-list-predicate; 2 - key-predicate */
    char quot;

    assert(in[0] == '[');

    *prefix = *id = *value = NULL;
    *prefix_len = *id_len = *value_len = 0;

    /* leading *WSP */
    for ( ; isspace(in[offset]); offset++) {}

    if (isdigit(in[offset])) {
        /* pos: "[" *WSP positive-integer-value *WSP "]" */
        if (in[offset] == '0') {
            /* zero */
            *errmsg = "The position predicate cannot be zero.";
            goto error;
        }

        /* positive-integer-value */
        *value = &in[offset++];
        for ( ; isdigit(in[offset]); offset++) {}
        *value_len = &in[offset] - *value;

    } else if (in[offset] == '.') {
        /* leaf-list-predicate: "[" *WSP "." *WSP "=" *WSP quoted-string *WSP "]" */
        *id = &in[offset];
        *id_len = 1;
        offset++;
        expr = 1;
    } else if (in[offset] == '-') {
        /* typically negative value */
        *errmsg = "Invalid instance predicate format (negative position or invalid node-identifier).";
        goto error;
    } else {
        /* key-predicate: "[" *WSP node-identifier *WSP "=" *WSP quoted-string *WSP "]" */
        in = &in[offset];
        if (ly_parse_nodeid(&in, prefix, prefix_len, id, id_len)) {
            *errmsg = "Invalid node-identifier.";
            goto error;
        }
        if ((format == LYD_XML) && !(*prefix)) {
            /* all node names MUST be qualified with explicit namespace prefix */
            *errmsg = "Missing prefix of a node name.";
            goto error;
        }
        offset = in - *pred;
        in = *pred;
        expr = 2;
    }

    if (expr) {
        /*  *WSP "=" *WSP quoted-string *WSP "]" */
        for ( ; isspace(in[offset]); offset++) {}

        if (in[offset] != '=') {
            if (expr == 1) {
                *errmsg = "Unexpected character instead of \'=\' in leaf-list-predicate.";
            } else { /* 2 */
                *errmsg = "Unexpected character instead of \'=\' in key-predicate.";
            }
            goto error;
        }
        offset++;
        for ( ; isspace(in[offset]); offset++) {}

        /* quoted-string */
        quot = in[offset++];
        if ((quot != '\'') && (quot != '\"')) {
            *errmsg = "String value is not quoted.";
            goto error;
        }
        *value = &in[offset];
        for ( ; offset < limit && (in[offset] != quot || (offset && in[offset - 1] == '\\')); offset++) {}
        if (in[offset] == quot) {
            *value_len = &in[offset] - *value;
            offset++;
        } else {
            *errmsg = "Value is not terminated quoted-string.";
            goto error;
        }
    }

    /* *WSP "]" */
    for ( ; isspace(in[offset]); offset++) {}
    if (in[offset] != ']') {
        if (expr == 0) {
            *errmsg = "Predicate (pos) is not terminated by \']\' character.";
        } else if (expr == 1) {
            *errmsg = "Predicate (leaf-list-predicate) is not terminated by \']\' character.";
        } else { /* 2 */
            *errmsg = "Predicate (key-predicate) is not terminated by \']\' character.";
        }
        goto error;
    }
    offset++;

    if (offset <= limit) {
        *pred = &in[offset];
        return LY_SUCCESS;
    }

    /* we read after the limit */
    *errmsg = "Predicate is incomplete.";
    *prefix = *id = *value = NULL;
    *prefix_len = *id_len = *value_len = 0;
    offset = limit;
    ret = LY_EINVAL;

error:
    *pred = &in[offset];
    return ret;
}